

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall
cmListFile::ParseFile
          (cmListFile *this,char *filename,cmMessenger *messenger,cmListFileBacktrace *lfbt)

{
  bool bVar1;
  cmListFileParser parser;
  allocator<char> local_d9;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_d8;
  cmListFileParser local_c8;
  
  bVar1 = cmsys::SystemTools::FileExists(filename);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,filename,&local_d9);
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    if (!bVar1) {
      std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_d8,
                 (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)lfbt)
      ;
      cmListFileParser::cmListFileParser
                (&local_c8,this,(cmListFileBacktrace *)&local_d8,messenger,filename);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d8._M_refcount);
      bVar1 = cmListFileParser::ParseFile(&local_c8);
      cmListFileParser::~cmListFileParser(&local_c8);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool cmListFile::ParseFile(const char* filename, cmMessenger* messenger,
                           cmListFileBacktrace const& lfbt)
{
  if (!cmSystemTools::FileExists(filename) ||
      cmSystemTools::FileIsDirectory(filename)) {
    return false;
  }

  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger, filename);
    parseError = !parser.ParseFile();
  }

  return !parseError;
}